

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O2

void __thiscall OpenMD::Velocitizer::removeComDrift(Velocitizer *this)

{
  Molecule *pMVar1;
  StuntDouble *this_00;
  pointer ppSVar2;
  MoleculeIterator mi;
  Vector3d vdrift;
  MoleculeIterator local_98;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Thermo::getComVel((Vector3d *)&local_90,&this->thermo_);
  local_98._M_node = (_Base_ptr)0x0;
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_98);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar2 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001dd3a3;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_78,this_00);
      operator-(&local_60,&local_78,&local_90);
      Vector<double,_3U>::Vector(&local_48,&local_60);
      StuntDouble::setVel(this_00,(Vector3d *)&local_48);
      ppSVar2 = ppSVar2 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar2 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001dd3a3:
        this_00 = *ppSVar2;
      }
    }
    pMVar1 = SimInfo::nextMolecule(this->info_,&local_98);
  }
  return;
}

Assistant:

void Velocitizer::removeComDrift() {
    // Get the Center of Mass drift velocity.
    Vector3d vdrift = thermo_.getComVel();

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    //  Corrects for the center of mass drift.
    // sums all the momentum and divides by total mass.
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        sd->setVel(sd->getVel() - vdrift);
      }
    }
  }